

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

void ppc32be_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  ar_info ai;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  ar_info *in_stack_fffffffffffffef8;
  _func_uint8_t_uint8_t_RelocInsert_ptr *in_stack_ffffffffffffff18;
  Elf32_Ehdr *in_stack_ffffffffffffff20;
  LinkFile *in_stack_ffffffffffffff28;
  GlobalVars *in_stack_ffffffffffffff30;
  void *local_20;
  
  if (*(char *)(in_RSI + 0x39) == '\b') {
    bVar1 = ar_init((ar_info *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                    (char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                    CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),(char *)0x12dc7a);
    if (bVar1 == 0) {
      ierror("ppc32be_readconv(): archive %s corrupted since last access",
             *(undefined8 *)(in_RSI + 0x10));
    }
    else {
      while (bVar1 = ar_extract(in_stack_fffffffffffffef8), bVar1 != 0) {
        pcVar2 = allocstring((char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        *(char **)(in_RSI + 0x20) = pcVar2;
        in_stack_fffffffffffffea0 = 0x14;
        elf_check_ar_type(fff[*(byte *)(in_RSI + 0x38)],*(char **)(in_RSI + 0x10),local_20,'\x01',
                          '\x02',1,3,0x14,0x11,0x9025);
        elf32_parse(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                    in_stack_ffffffffffffff18);
      }
    }
  }
  else {
    *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x18);
    elf32_parse(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                in_stack_ffffffffffffff18);
  }
  return;
}

Assistant:

static void ppc32be_readconv(struct GlobalVars *gv,struct LinkFile *lf)
/* Read elfppc32be executable / object / shared obj. */
{
  if (lf->type == ID_LIBARCH) {
    struct ar_info ai;

    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,
                          ELFCLASS32,ELFDATA2MSB,ELF_VER,
                          3,EM_PPC,EM_PPC_OLD,EM_CYGNUS_POWERPC);
        elf32_parse(gv,lf,(struct Elf32_Ehdr *)ai.data,
                    ppc32_reloc_elf2vlink);
      }
    }
    else
      ierror("ppc32be_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(struct Elf32_Ehdr *)lf->data,ppc32_reloc_elf2vlink);
  }
}